

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

int register_ind_in_table
              (opc_handler_t_conflict **table,uchar idx1,uchar idx2,opc_handler_t_conflict *handler)

{
  opc_handler_t_conflict **table_00;
  undefined7 in_register_00000031;
  ulong uVar1;
  opc_handler_t_conflict *poVar2;
  
  uVar1 = CONCAT71(in_register_00000031,idx1) & 0xffffffff;
  poVar2 = table[uVar1];
  if (poVar2 == &invalid_handler) {
    table_00 = (opc_handler_t_conflict **)g_malloc(0x100);
    fill_new_table(table_00,0x20);
    poVar2 = (opc_handler_t_conflict *)((ulong)table_00 | 1);
    table[uVar1] = poVar2;
  }
  else if (((uint)poVar2 & 3) != 1) {
    printf("*** ERROR: idx %02x already assigned to a direct opcode\n",idx1);
    return -1;
  }
  if (handler != (opc_handler_t_conflict *)0x0) {
    uVar1 = (ulong)idx2;
    if (*(opc_handler_t_conflict **)(((ulong)poVar2 & 0xfffffffffffffffc) + uVar1 * 8) !=
        &invalid_handler) {
      printf("*** ERROR: opcode %02x already assigned in opcode table %02x\n",uVar1,idx1);
      return -1;
    }
    *(opc_handler_t_conflict **)(((ulong)poVar2 & 0xfffffffffffffffc) + uVar1 * 8) = handler;
    return 0;
  }
  return 0;
}

Assistant:

static int register_ind_in_table(opc_handler_t **table,
                                 unsigned char idx1, unsigned char idx2,
                                 opc_handler_t *handler)
{
    if (table[idx1] == &invalid_handler) {
        if (create_new_table(table, idx1) < 0) {
            printf("*** ERROR: unable to create indirect table "
                   "idx=%02x\n", idx1);
            return -1;
        }
    } else {
        if (!is_indirect_opcode(table[idx1])) {
            printf("*** ERROR: idx %02x already assigned to a direct "
                   "opcode\n", idx1);
#if defined(DO_PPC_STATISTICS) || defined(PPC_DUMP_CPU)
            printf("           Registered handler '%s' - new handler '%s'\n",
                   ind_table(table[idx1])[idx2]->oname, handler->oname);
#endif
            return -1;
        }
    }
    if (handler != NULL &&
        insert_in_table(ind_table(table[idx1]), idx2, handler) < 0) {
        printf("*** ERROR: opcode %02x already assigned in "
               "opcode table %02x\n", idx2, idx1);
#if defined(DO_PPC_STATISTICS) || defined(PPC_DUMP_CPU)
        printf("           Registered handler '%s' - new handler '%s'\n",
               ind_table(table[idx1])[idx2]->oname, handler->oname);
#endif
        return -1;
    }

    return 0;
}